

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_i2rescale(fitsfile *infptr,int naxis,long *naxes,double rescale,fitsfile *outfptr,int *status
                )

{
  short sVar1;
  size_t sVar2;
  int *piVar3;
  fitsfile *pfVar4;
  int iVar5;
  void *__ptr;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  short nullvalue;
  int *local_70;
  int local_64;
  double local_60;
  fitsfile *local_58;
  fitsfile *local_50;
  size_t local_48;
  long local_40;
  int tstatus;
  int anynul;
  
  sVar2 = *naxes;
  lVar7 = 1;
  lVar10 = lVar7;
  for (; lVar7 < naxis; lVar7 = lVar7 + 1) {
    lVar10 = lVar10 * naxes[lVar7];
  }
  local_70 = status;
  local_60 = rescale;
  local_58 = infptr;
  local_50 = outfptr;
  __ptr = calloc(sVar2,2);
  pfVar4 = local_58;
  if (__ptr == (void *)0x0) {
    *local_70 = 0x71;
    iVar5 = 0x71;
  }
  else {
    tstatus = 0;
    lVar7 = 0;
    ffgky(local_58,0x15,"BLANK",&nullvalue,0,&tstatus);
    piVar3 = local_70;
    local_64 = tstatus;
    ffpscl(0x3ff0000000000000,0,pfVar4,local_70);
    ffpscl(0x3ff0000000000000,0,local_50,piVar3);
    sVar8 = 0;
    if (0 < (long)sVar2) {
      sVar8 = sVar2;
    }
    if (lVar10 < 1) {
      lVar10 = lVar7;
    }
    lVar9 = 1;
    local_48 = sVar2;
    while (lVar7 != lVar10) {
      ffgpvi(local_58,1,lVar9,local_48,0,__ptr,&anynul,local_70);
      sVar2 = local_48;
      if (local_64 == 0) {
        for (sVar6 = 0; sVar8 != sVar6; sVar6 = sVar6 + 1) {
          sVar1 = *(short *)((long)__ptr + sVar6 * 2);
          if (sVar1 != nullvalue) {
            dVar11 = (double)(int)sVar1 / local_60;
            *(short *)((long)__ptr + sVar6 * 2) =
                 (short)(int)(dVar11 + *(double *)(&DAT_001095a0 + (ulong)(dVar11 < 0.0) * 8));
          }
        }
      }
      else {
        for (sVar6 = 0; sVar8 != sVar6; sVar6 = sVar6 + 1) {
          dVar11 = (double)(int)*(short *)((long)__ptr + sVar6 * 2) / local_60;
          *(short *)((long)__ptr + sVar6 * 2) =
               (short)(int)(dVar11 + *(double *)(&DAT_001095a0 + (ulong)(dVar11 < 0.0) * 8));
        }
      }
      local_40 = lVar7;
      ffppri(local_50,1,lVar9,local_48,__ptr,local_70);
      lVar9 = lVar9 + sVar2;
      lVar7 = local_40 + 1;
    }
    free(__ptr);
    iVar5 = *local_70;
  }
  return iVar5;
}

Assistant:

int fp_i2rescale(fitsfile *infptr, int naxis, long *naxes, double rescale,
    fitsfile *outfptr, int *status)
{
/*
    divide the integer pixel values in the input file by rescale,
    and write back out to the output file..
*/

	long ii, jj, nelem = 1, nx, ny;
	short *intarray, nullvalue;
	int anynul, tstatus, checknull = 1;
	
	nx = naxes[0];
	ny = 1;
	
	for (ii = 1; ii < naxis; ii++) {
	    ny = ny * naxes[ii];
	}

	intarray = calloc(nx, sizeof(short));
	if (!intarray) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* read the null value keyword (BLANK) if present */
	tstatus = 0;
	fits_read_key(infptr, TSHORT, "BLANK", &nullvalue, 0, &tstatus);
	if (tstatus) {
	   checknull = 0;
	}

	/* turn off any scaling of the integer pixel values */
	fits_set_bscale(infptr,  1.0, 0.0, status);
	fits_set_bscale(outfptr, 1.0, 0.0, status);

	for (ii = 0; ii < ny; ii++) {

	    fits_read_img_sht(infptr, 1, nelem, nx,
	        0, intarray, &anynul, status);

	    if (checknull) {
	        for (jj = 0; jj < nx; jj++) {
	            if (intarray[jj] != nullvalue)
		        intarray[jj] = NSHRT( (intarray[jj] / rescale) );
		}
	    } else {
	        for (jj = 0; jj < nx; jj++)
		        intarray[jj] = NSHRT( (intarray[jj] / rescale) );
	    }

	    fits_write_img_sht(outfptr, 1, nelem, nx, intarray, status);
	      
	    nelem += nx;
	}

	free(intarray);
	return(*status);
}